

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_client::handle_result
          (coro_http_client *this,resp_data *data,error_code ec,bool is_keep_alive)

{
  bool bVar1;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDI;
  byte in_R8B;
  undefined4 in_stack_fffffffffffffff4;
  
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xfffffffffffffff0);
  if (bVar1) {
    std::
    __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    close_socket((socket_t *)CONCAT44(in_stack_fffffffffffffff4,in_EDX));
    *in_RSI = CONCAT44(in_stack_fffffffffffffff4,in_EDX);
    in_RSI[1] = in_RCX;
    *(undefined4 *)(in_RSI + 2) = 0x194;
  }
  else if ((in_R8B & 1) == 0) {
    std::
    __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    close_socket((socket_t *)CONCAT44(in_stack_fffffffffffffff4,in_EDX));
  }
  return;
}

Assistant:

void handle_result(resp_data &data, std::error_code ec, bool is_keep_alive) {
    if (ec) {
      close_socket(*socket_);
      data.net_err = ec;
      data.status = 404;
#ifdef BENCHMARK_TEST
      if (!stop_bench_) {
        CINATRA_LOG_DEBUG << ec.message();
      }
#endif
    }
    else {
      if (!is_keep_alive) {
        close_socket(*socket_);
      }
    }
  }